

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O0

char * google::protobuf::internal::
       ReadPackedVarintArray<google::protobuf::internal::WireFormat::_InternalParseAndMergeField(google::protobuf::Message*,char_const*,google::protobuf::internal::ParseContext*,unsigned_long,google::protobuf::Reflection_const*,google::protobuf::FieldDescriptor_const*)::__0>
                 (char *ptr,char *end,anon_class_32_4_91646d40 add)

{
  unsigned_long local_28;
  uint64_t varint;
  char *end_local;
  char *ptr_local;
  
  varint = (uint64_t)end;
  end_local = ptr;
  while( true ) {
    if (varint <= end_local) {
      return end_local;
    }
    end_local = VarintParse<unsigned_long>(end_local,&local_28);
    if (end_local == (char *)0x0) break;
    WireFormat::_InternalParseAndMergeField::anon_class_32_4_91646d40::operator()
              (&add,(int32_t)local_28);
  }
  return (char *)0x0;
}

Assistant:

const char* ReadPackedVarintArray(const char* ptr, const char* end, Add add) {
  while (ptr < end) {
    uint64_t varint;
    ptr = VarintParse(ptr, &varint);
    if (ptr == nullptr) return nullptr;
    add(varint);
  }
  return ptr;
}